

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O1

void HTS_Engine_clear(HTS_Engine *engine)

{
  double *pdVar1;
  size_t sVar2;
  ulong uVar3;
  
  pdVar1 = (engine->condition).msd_threshold;
  if (pdVar1 != (double *)0x0) {
    HTS_free(pdVar1);
  }
  pdVar1 = (engine->condition).duration_iw;
  if (pdVar1 != (double *)0x0) {
    HTS_free(pdVar1);
  }
  pdVar1 = (engine->condition).gv_weight;
  if (pdVar1 != (double *)0x0) {
    HTS_free(pdVar1);
  }
  if ((engine->condition).parameter_iw != (double **)0x0) {
    sVar2 = HTS_ModelSet_get_nvoices(&engine->ms);
    if (sVar2 != 0) {
      uVar3 = 0;
      do {
        HTS_free((engine->condition).parameter_iw[uVar3]);
        uVar3 = uVar3 + 1;
        sVar2 = HTS_ModelSet_get_nvoices(&engine->ms);
      } while (uVar3 < sVar2);
    }
    HTS_free((engine->condition).parameter_iw);
  }
  if ((engine->condition).gv_iw != (double **)0x0) {
    sVar2 = HTS_ModelSet_get_nvoices(&engine->ms);
    if (sVar2 != 0) {
      uVar3 = 0;
      do {
        HTS_free((engine->condition).gv_iw[uVar3]);
        uVar3 = uVar3 + 1;
        sVar2 = HTS_ModelSet_get_nvoices(&engine->ms);
      } while (uVar3 < sVar2);
    }
    HTS_free((engine->condition).gv_iw);
  }
  HTS_ModelSet_clear(&engine->ms);
  HTS_Audio_clear(&engine->audio);
  HTS_Engine_initialize(engine);
  return;
}

Assistant:

void HTS_Engine_clear(HTS_Engine * engine)
{
   size_t i;

   if (engine->condition.msd_threshold != NULL)
      HTS_free(engine->condition.msd_threshold);
   if (engine->condition.duration_iw != NULL)
      HTS_free(engine->condition.duration_iw);
   if (engine->condition.gv_weight != NULL)
      HTS_free(engine->condition.gv_weight);
   if (engine->condition.parameter_iw != NULL) {
      for (i = 0; i < HTS_ModelSet_get_nvoices(&engine->ms); i++)
         HTS_free(engine->condition.parameter_iw[i]);
      HTS_free(engine->condition.parameter_iw);
   }
   if (engine->condition.gv_iw != NULL) {
      for (i = 0; i < HTS_ModelSet_get_nvoices(&engine->ms); i++)
         HTS_free(engine->condition.gv_iw[i]);
      HTS_free(engine->condition.gv_iw);
   }

   HTS_ModelSet_clear(&engine->ms);
   HTS_Audio_clear(&engine->audio);
   HTS_Engine_initialize(engine);
}